

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O2

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  FILE *tmp;
  char local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  filename_t local_b0;
  string local_90;
  filename_t local_70;
  filename_t local_50;
  
  close(this,(int)__file);
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  iVar4 = 0;
  do {
    if (this->open_tries_ <= iVar4) {
      os::filename_to_str(&local_90,&this->filename_);
      std::operator+(&local_d0,"Failed opening file ",&local_90);
      std::operator+(&local_b0,&local_d0," for writing");
      piVar3 = __errno_location();
      throw_spdlog_ex(&local_b0,*piVar3);
    }
    std::__cxx11::string::string((string *)&local_70,(string *)__file);
    os::dir_name(&local_50,&local_70);
    os::create_dir(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    local_e4 = (char)__oflag;
    if (local_e4 == '\0') {
LAB_00131132:
      std::__cxx11::string::string((string *)&local_b0,"ab",(allocator *)&local_d0);
      bVar1 = os::fopen_s(&this->fd_,(filename_t *)__file,&local_b0);
      iVar2 = std::__cxx11::string::~string((string *)&local_b0);
      if (!bVar1) {
        return iVar2;
      }
      os::sleep_for_millis(this->open_interval_);
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,"wb",(allocator *)&local_90);
      bVar1 = os::fopen_s((FILE **)&local_d0,(filename_t *)__file,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (!bVar1) {
        fclose((FILE *)local_d0._M_dataplus._M_p);
        goto LAB_00131132;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

SPDLOG_INLINE void file_helper::open(const filename_t &fname, bool truncate)
{
    close();
    filename_ = fname;

    auto *mode = SPDLOG_FILENAME_T("ab");
    auto *trunc_mode = SPDLOG_FILENAME_T("wb");

    for (int tries = 0; tries < open_tries_; ++tries)
    {
        // create containing folder if not exists already.
        os::create_dir(os::dir_name(fname));
        if (truncate)
        {
            // Truncate by opening-and-closing a tmp file in "wb" mode, always
            // opening the actual log-we-write-to in "ab" mode, since that
            // interacts more politely with eternal processes that might
            // rotate/truncate the file underneath us.
            std::FILE *tmp;
            if (os::fopen_s(&tmp, fname, trunc_mode))
            {
                continue;
            }
            std::fclose(tmp);
        }
        if (!os::fopen_s(&fd_, fname, mode))
        {
            return;
        }

        details::os::sleep_for_millis(open_interval_);
    }

    throw_spdlog_ex("Failed opening file " + os::filename_to_str(filename_) + " for writing", errno);
}